

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::ReadFromBinaryArchive(ON_Buffer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON__UINT64 OVar4;
  size_t sStack_90;
  ON__UINT32 buffer_crc;
  ON__UINT64 read_size;
  ulong uStack_80;
  bool buffer_rc;
  ON__UINT64 size;
  ON__UINT64 a_capacity;
  ON__UINT64 extra_size;
  void *a;
  bool rc;
  ON__UINT64 OStack_58;
  ON__UINT32 saved_buffer_crc;
  ON__UINT64 saved_buffer_size;
  ON_3DM_BIG_CHUNK c0;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_Buffer *this_local;
  
  Destroy(this);
  c0.m_crc32 = 0;
  c0.m_do_crc16 = '\0';
  c0.m_do_crc32 = '\0';
  c0.m_crc16 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (archive,0x28100,(int *)&c0.m_crc32,(int *)&c0.m_do_crc16);
  if (!bVar1) {
    return false;
  }
  ON_3DM_BIG_CHUNK::ON_3DM_BIG_CHUNK((ON_3DM_BIG_CHUNK *)&saved_buffer_size);
  memset(&saved_buffer_size,0,0x28);
  ON_BinaryArchive::GetCurrentChunk(archive,(ON_3DM_BIG_CHUNK *)&saved_buffer_size);
  OStack_58 = 0;
  a._4_4_ = 0;
  a._3_1_ = 0;
  extra_size = 0;
  if (((c0.m_crc32 != 1) ||
      (bVar1 = ON_BinaryArchive::ReadBigInt(archive,&stack0xffffffffffffffa8), !bVar1)) ||
     (bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__UINT32 *)((long)&a + 4)), !bVar1))
  goto LAB_005eba12;
  if (c0._32_4_ == 0) {
    OVar4 = ON_3DM_BIG_CHUNK::Length((ON_3DM_BIG_CHUNK *)&saved_buffer_size);
    if (OVar4 != OStack_58 + 0x18) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x51b,"","corrupt archive");
      goto LAB_005eba12;
    }
  }
  else {
    OVar4 = ON_3DM_BIG_CHUNK::Length((ON_3DM_BIG_CHUNK *)&saved_buffer_size);
    if (OVar4 < OStack_58 + 0x18) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x524,"","corrupt archive");
      goto LAB_005eba12;
    }
  }
  if (OStack_58 != 0) {
    size = OStack_58;
    if (0x10000 < OStack_58) {
      size = 0x10000;
    }
    extra_size = (ON__UINT64)onmalloc(size);
    if ((void *)extra_size == (void *)0x0) goto LAB_005eba12;
    bVar1 = true;
    for (uStack_80 = 0; uStack_80 < OStack_58; uStack_80 = sStack_90 + uStack_80) {
      sStack_90 = size;
      if (OStack_58 - uStack_80 < size) {
        sStack_90 = OStack_58 - uStack_80;
      }
      bVar2 = ON_BinaryArchive::ReadByte(archive,sStack_90,(void *)extra_size);
      if (!bVar2) {
        bVar1 = false;
        break;
      }
      Write(this,sStack_90,(void *)extra_size);
    }
    if (!bVar1) goto LAB_005eba12;
  }
  a._3_1_ = 1;
LAB_005eba12:
  if (extra_size != 0) {
    onfree((void *)extra_size);
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  if (!bVar1) {
    a._3_1_ = 0;
  }
  if ((a._3_1_ & 1) == 0) {
    Destroy(this);
  }
  else {
    Compact(this);
    OVar3 = CRC32(this,0);
    if ((OVar3 != a._4_4_) || (this->m_buffer_size != OStack_58)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x556,"","The buffer contents were corrupted during, writing, storage or reading."
                );
    }
  }
  return (bool)(a._3_1_ & 1);
}

Assistant:

bool ON_Buffer::ReadFromBinaryArchive( ON_BinaryArchive& archive )
{
  Destroy();
  
  int major_version = 0;
  int minor_version = 0;
  if ( !archive.BeginRead3dmChunk(TCODE_OPENNURBS_BUFFER,&major_version,&minor_version) )
    return false;

  ON_3DM_BIG_CHUNK c0;
  memset(&c0,0,sizeof(c0));
  archive.GetCurrentChunk(c0);

  ON__UINT64 saved_buffer_size = 0;
  ON__UINT32 saved_buffer_crc = 0;
  bool rc = false;
  void* a = 0;
  for(;;)
  {
    if ( 1 != major_version )
      break;
    
    if ( !archive.ReadBigInt(&saved_buffer_size) )
      break;

    if ( !archive.ReadInt(&saved_buffer_crc) )
      break;

    const ON__UINT64 extra_size = 24; // =
                                      //  4  ( major version number )
                                      // +4  ( minor version number )
                                      // +8  ( 64-bit buffer_size )
                                      // +4  ( 32-bit buffer_crc )
                                      // +4  ( 32-bit chunk crc )
    if ( 0 == minor_version )
    {
      if ( c0.Length() != extra_size + saved_buffer_size )
      {
        ON_ERROR("corrupt archive");
        break;
      }
    }
    else if ( c0.Length() < extra_size + saved_buffer_size )
    {
      // later versions may add more information
      // but there still needs to be enough room
      // to store the buffer.
      ON_ERROR("corrupt archive");
      break;
    }

    if ( saved_buffer_size > 0 )
    {
      ON__UINT64 a_capacity = saved_buffer_size;
      if ( a_capacity > 16*4096 )
        a_capacity = 16*4096;
      a = onmalloc((size_t)a_capacity);
      if ( 0 == a )
        break;
      ON__UINT64 size = 0;
      bool buffer_rc = true;
      while( size < saved_buffer_size )
      {
        ON__UINT64 read_size = a_capacity;
        if ( read_size > saved_buffer_size - size )
          read_size = saved_buffer_size - size;
        if ( !archive.ReadByte((size_t)read_size,a) )
        {
          buffer_rc = false;
          break;
        }
        // add to buffer
        Write(read_size,a);
        size += read_size;
      }
    
      if ( !buffer_rc )
        break;
    }

    rc = true;
    break;
  }

  if ( 0 != a )
    onfree(a);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  if ( rc )
  {
    Compact();
    const ON__UINT32 buffer_crc = CRC32(0);
    if ( buffer_crc != saved_buffer_crc || m_buffer_size != saved_buffer_size)
    {
      // The buffer's contents have been damaged.
      ON_ERROR("The buffer contents were corrupted during, writing, storage or reading.");
    }
  }
  else
  {
    Destroy();
  }

  return rc;
}